

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void stack_node_release(StackNode *self,StackNodeArray *pool,SubtreePool *subtree_pool)

{
  uint uVar1;
  StackNode *self_00;
  Subtree self_01;
  undefined8 *puVar2;
  StackLink link;
  StackLink link_1;
  StackNodeArray *pSStack_28;
  uint i;
  StackNode *first_predecessor;
  SubtreePool *subtree_pool_local;
  StackNodeArray *pool_local;
  StackNode *self_local;
  
  pool_local = (StackNodeArray *)self;
  while( true ) {
    if (*(int *)((long)&pool_local[0xd].contents + 4) == 0) {
      __assert_fail("self->ref_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x60,"void stack_node_release(StackNode *, StackNodeArray *, SubtreePool *)");
    }
    *(int *)((long)&pool_local[0xd].contents + 4) =
         *(int *)((long)&pool_local[0xd].contents + 4) + -1;
    if (*(int *)((long)&pool_local[0xd].contents + 4) != 0) break;
    pSStack_28 = (StackNodeArray *)0x0;
    if (*(short *)&pool_local[0xd].contents != 0) {
      link_1._20_4_ = ZEXT24(*(ushort *)&pool_local[0xd].contents);
      while (link_1._20_4_ = link_1._20_4_ - 1, link_1._20_4_ != 0) {
        puVar2 = (undefined8 *)((long)pool_local + (ulong)(uint)link_1._20_4_ * 0x18 + 0x10);
        self_00 = (StackNode *)*puVar2;
        self_01 = *(Subtree *)(puVar2 + 1);
        if (self_01.ptr != (SubtreeHeapData *)0x0) {
          ts_subtree_release(subtree_pool,self_01);
        }
        stack_node_release(self_00,pool,subtree_pool);
      }
      if ((*(Subtree *)&pool_local[1].size).ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_release(subtree_pool,*(Subtree *)&pool_local[1].size);
      }
      pSStack_28 = (StackNodeArray *)pool_local[1].contents;
    }
    if (pool->size < 0x32) {
      array__grow((VoidArray *)pool,8);
      uVar1 = pool->size;
      pool->size = uVar1 + 1;
      pool->contents[uVar1] = (StackNode *)pool_local;
    }
    else {
      ts_free(pool_local);
    }
    if (pSStack_28 == (StackNodeArray *)0x0) {
      return;
    }
    pool_local = pSStack_28;
  }
  return;
}

Assistant:

static void stack_node_release(StackNode *self, StackNodeArray *pool, SubtreePool *subtree_pool) {
recur:
  assert(self->ref_count != 0);
  self->ref_count--;
  if (self->ref_count > 0) return;

  StackNode *first_predecessor = NULL;
  if (self->link_count > 0) {
    for (unsigned i = self->link_count - 1; i > 0; i--) {
      StackLink link = self->links[i];
      if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
      stack_node_release(link.node, pool, subtree_pool);
    }
    StackLink link = self->links[0];
    if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
    first_predecessor = self->links[0].node;
  }

  if (pool->size < MAX_NODE_POOL_SIZE) {
    array_push(pool, self);
  } else {
    ts_free(self);
  }

  if (first_predecessor) {
    self = first_predecessor;
    goto recur;
  }
}